

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supplies.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::Supplies::Decode(Supplies *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xb < KVar1) {
    EntityType::Decode(&this->super_EntityType,stream);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Quantity);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Supplies::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < SUPPLIES_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    EntityType::Decode( stream );
    stream >> m_f32Quantity;
}